

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_function.hpp
# Opt level: O0

scalar_function_t *
duckdb::ScalarFunction::GetScalarUnaryFunctionFixedReturn<signed_char,duckdb::SignOperator>
          (LogicalType *type)

{
  LogicalTypeId LVar1;
  InternalException *this;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **__f;
  LogicalType *in_RSI;
  scalar_function_t *in_RDI;
  scalar_function_t *function;
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
  *in_stack_ffffffffffffff30;
  allocator *paVar2;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  allocator local_99;
  string local_98 [32];
  code *local_78;
  code *local_70;
  code *local_68;
  code *local_60;
  code *local_58;
  code *local_50;
  code *local_48;
  code *local_40;
  code *local_38;
  code *local_30;
  code *local_28;
  code *local_20;
  undefined1 local_11;
  LogicalType *local_10;
  
  local_11 = 0;
  local_10 = in_RSI;
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::function
            (in_stack_ffffffffffffff30);
  LVar1 = LogicalType::id(local_10);
  __f = (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **)(ulong)(byte)(LVar1 - TINYINT);
  switch(__f) {
  case (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **)0x0:
    local_20 = UnaryFunction<signed_char,signed_char,duckdb::SignOperator>;
    std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
              ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),__f);
    break;
  case (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **)0x1:
    local_28 = UnaryFunction<short,signed_char,duckdb::SignOperator>;
    std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
              ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),__f);
    break;
  case (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **)0x2:
    local_30 = UnaryFunction<int,signed_char,duckdb::SignOperator>;
    std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
              ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),__f);
    break;
  case (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **)0x3:
    local_38 = UnaryFunction<long,signed_char,duckdb::SignOperator>;
    std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
              ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),__f);
    break;
  default:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    paVar2 = &local_99;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_98,"Unimplemented type for GetScalarUnaryFunctionFixedReturn",paVar2);
    duckdb::InternalException::InternalException(this,local_98);
    __cxa_throw(this,&InternalException::typeinfo,InternalException::~InternalException);
  case (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **)0xb:
    local_70 = UnaryFunction<float,signed_char,duckdb::SignOperator>;
    std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
              ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),__f);
    break;
  case (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **)0xc:
    local_78 = UnaryFunction<double,signed_char,duckdb::SignOperator>;
    std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
              ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),__f);
    break;
  case (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **)0x11:
    local_40 = UnaryFunction<unsigned_char,signed_char,duckdb::SignOperator>;
    std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
              ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),__f);
    break;
  case (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **)0x12:
    local_48 = UnaryFunction<unsigned_short,signed_char,duckdb::SignOperator>;
    std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
              ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),__f);
    break;
  case (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **)0x13:
    local_50 = UnaryFunction<unsigned_int,signed_char,duckdb::SignOperator>;
    std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
              ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),__f);
    break;
  case (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **)0x14:
    local_58 = UnaryFunction<unsigned_long,signed_char,duckdb::SignOperator>;
    std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
              ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),__f);
    break;
  case (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **)0x26:
    local_68 = UnaryFunction<duckdb::uhugeint_t,signed_char,duckdb::SignOperator>;
    std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
              ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),__f);
    break;
  case (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **)0x27:
    local_60 = UnaryFunction<duckdb::hugeint_t,signed_char,duckdb::SignOperator>;
    std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
              ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),__f);
  }
  return in_RDI;
}

Assistant:

static scalar_function_t GetScalarUnaryFunctionFixedReturn(const LogicalType &type) {
		scalar_function_t function;
		switch (type.id()) {
		case LogicalTypeId::TINYINT:
			function = &ScalarFunction::UnaryFunction<int8_t, TR, OP>;
			break;
		case LogicalTypeId::SMALLINT:
			function = &ScalarFunction::UnaryFunction<int16_t, TR, OP>;
			break;
		case LogicalTypeId::INTEGER:
			function = &ScalarFunction::UnaryFunction<int32_t, TR, OP>;
			break;
		case LogicalTypeId::BIGINT:
			function = &ScalarFunction::UnaryFunction<int64_t, TR, OP>;
			break;
		case LogicalTypeId::UTINYINT:
			function = &ScalarFunction::UnaryFunction<uint8_t, TR, OP>;
			break;
		case LogicalTypeId::USMALLINT:
			function = &ScalarFunction::UnaryFunction<uint16_t, TR, OP>;
			break;
		case LogicalTypeId::UINTEGER:
			function = &ScalarFunction::UnaryFunction<uint32_t, TR, OP>;
			break;
		case LogicalTypeId::UBIGINT:
			function = &ScalarFunction::UnaryFunction<uint64_t, TR, OP>;
			break;
		case LogicalTypeId::HUGEINT:
			function = &ScalarFunction::UnaryFunction<hugeint_t, TR, OP>;
			break;
		case LogicalTypeId::UHUGEINT:
			function = &ScalarFunction::UnaryFunction<uhugeint_t, TR, OP>;
			break;
		case LogicalTypeId::FLOAT:
			function = &ScalarFunction::UnaryFunction<float, TR, OP>;
			break;
		case LogicalTypeId::DOUBLE:
			function = &ScalarFunction::UnaryFunction<double, TR, OP>;
			break;
		default:
			throw InternalException("Unimplemented type for GetScalarUnaryFunctionFixedReturn");
		}
		return function;
	}